

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::is_per_primitive_variable(CompilerGLSL *this,SPIRVariable *var)

{
  size_t sVar1;
  bool bVar2;
  SPIRType *pSVar3;
  uint32_t index;
  bool bVar4;
  
  bVar2 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                     DecorationPerPrimitiveEXT);
  bVar4 = true;
  if (!bVar2) {
    pSVar3 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
    bVar2 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id,Block);
    index = 0;
    bVar4 = false;
    if (bVar2) {
      sVar1 = (pSVar3->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      do {
        bVar4 = (uint32_t)sVar1 == index;
        if (bVar4) {
          return bVar4;
        }
        bVar2 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,index,
                           DecorationPerPrimitiveEXT);
        index = index + 1;
      } while (bVar2);
    }
  }
  return bVar4;
}

Assistant:

bool CompilerGLSL::is_per_primitive_variable(const SPIRVariable &var) const
{
	if (has_decoration(var.self, DecorationPerPrimitiveEXT))
		return true;

	auto &type = get<SPIRType>(var.basetype);
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0, n = uint32_t(type.member_types.size()); i < n; i++)
		if (!has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			return false;

	return true;
}